

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core-C-API.cpp
# Opt level: O0

void llb_buildengine_task_needs_input(llb_task_interface_t ti,llb_data_t *key,uintptr_t input_id)

{
  KeyType local_50;
  TaskInterface *local_30;
  TaskInterface *coreti;
  uintptr_t input_id_local;
  llb_data_t *key_local;
  llb_task_interface_t ti_local;
  
  ti_local.impl = ti.ctx;
  key_local = (llb_data_t *)ti.impl;
  local_30 = (TaskInterface *)&key_local;
  coreti = (TaskInterface *)input_id;
  input_id_local = (uintptr_t)key;
  llbuild::core::KeyType::KeyType(&local_50,(char *)key->data,key->length);
  llbuild::core::TaskInterface::request((TaskInterface *)&key_local,&local_50,(uintptr_t)coreti);
  llbuild::core::KeyType::~KeyType(&local_50);
  return;
}

Assistant:

void llb_buildengine_task_needs_input(llb_task_interface_t ti,
                                      const llb_data_t* key,
                                      uintptr_t input_id) {
  auto coreti = reinterpret_cast<TaskInterface*>(&ti);
  coreti->request(KeyType((const char*)key->data, key->length), input_id);
}